

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfThenElseEvaluationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  byte condition;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string *errorMessage;
  Variable y;
  Variable x;
  string *in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcf0;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  Variable *in_stack_fffffffffffffd68;
  Variable *in_stack_fffffffffffffd70;
  Expression *in_stack_fffffffffffffd78;
  string local_278 [8];
  Variable *in_stack_fffffffffffffd90;
  Variable *in_stack_fffffffffffffd98;
  string local_258 [32];
  undefined4 local_238;
  undefined4 local_234;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [156];
  int local_4;
  
  local_4 = 0;
  Kandinsky::Variable::Variable((Variable *)0x1164ae);
  Kandinsky::Variable::Variable((Variable *)0x1164bb);
  Kandinsky::Variable::setValue
            ((Variable *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             (double)in_stack_fffffffffffffcb8);
  Kandinsky::Variable::setValue
            ((Variable *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),
             (double)in_stack_fffffffffffffcb8);
  Kandinsky::operator><Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  Kandinsky::ifThenElse<Kandinsky::Expression,_Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  dVar2 = Kandinsky::Expression::evaluate((Expression *)0x11653e);
  bVar1 = -(dVar2 == 3.0) & 1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Kandinsky::Variable::evaluate((Variable *)0x116572);
  std::__cxx11::to_string((double)in_stack_fffffffffffffcc8);
  std::operator+((char *)in_stack_fffffffffffffcc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  std::operator+(in_stack_fffffffffffffcc8,
                 (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Kandinsky::Variable::evaluate((Variable *)0x1165d8);
  std::__cxx11::to_string((double)in_stack_fffffffffffffcc8);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffcf0));
  std::operator+(in_stack_fffffffffffffcc8,
                 (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Kandinsky::Variable::evaluate((Variable *)0x11663f);
  std::__cxx11::to_string((double)in_stack_fffffffffffffcc8);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffcf0));
  std::operator+(in_stack_fffffffffffffcc8,
                 (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Kandinsky::Variable::evaluate((Variable *)0x1166a6);
  std::__cxx11::to_string((double)in_stack_fffffffffffffcc8);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffcf0));
  std::operator+(in_stack_fffffffffffffcc8,
                 (char *)CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
  Kandinsky::assertOrExit((bool)in_stack_fffffffffffffcc7,in_stack_fffffffffffffcb8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_1a0);
  Kandinsky::Expression::~Expression((Expression *)0x1167c2);
  Kandinsky::Expression::~Expression((Expression *)0x1167cf);
  local_234 = 4;
  Kandinsky::operator><Kandinsky::Variable,_int,_nullptr>
            (in_stack_fffffffffffffd98,(int *)in_stack_fffffffffffffd90);
  local_238 = 4;
  Kandinsky::ifThenElse<Kandinsky::Expression,_Kandinsky::Variable,_int,_nullptr>
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,(int *)in_stack_fffffffffffffd68);
  dVar2 = Kandinsky::Expression::evaluate((Expression *)0x116838);
  condition = -(dVar2 == 4.0) & 1;
  __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Kandinsky::Variable::evaluate((Variable *)0x11686c);
  std::__cxx11::to_string((double)__lhs_00);
  std::operator+((char *)__lhs_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(condition,in_stack_fffffffffffffcc0));
  std::operator+(__lhs_00,(char *)CONCAT17(condition,in_stack_fffffffffffffcc0));
  errorMessage = (string *)Kandinsky::Variable::evaluate((Variable *)0x1168cc);
  std::__cxx11::to_string((double)__lhs_00);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffcf0));
  std::operator+(__lhs_00,(char *)CONCAT17(condition,in_stack_fffffffffffffcc0));
  Kandinsky::assertOrExit((bool)condition,errorMessage);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string(local_2d8);
  Kandinsky::Expression::~Expression((Expression *)0x11698c);
  Kandinsky::Expression::~Expression((Expression *)0x116999);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x1169b1);
  Kandinsky::Variable::~Variable((Variable *)0x1169be);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(2);
    assertOrExit((ifThenElse(x > y, x, y)).evaluate() == 3,
            "(" + std::to_string(x.evaluate()) + " > " + std::to_string(y.evaluate()) + ") ? "
            + std::to_string(x.evaluate()) + " : " + std::to_string(y.evaluate()) + " != 3");
    assertOrExit((ifThenElse(x > 4, x, 4)).evaluate() == 4,
            "(" + std::to_string(x.evaluate()) + " > 4) ? "
            + std::to_string(x.evaluate()) + " : 4 != 4");
    return 0;
}